

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  domain_error *pdVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar7;
  ostringstream oss;
  allocator local_2b2;
  allocator local_2b1;
  undefined1 local_2b0 [32];
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  size_t local_270;
  TagAliasRegistry *local_260;
  SourceLineInfo *local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  string local_230;
  SourceLineInfo local_210;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [24];
  char local_190 [16];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  size_t local_160;
  
  local_260 = this;
  std::__cxx11::string::string((string *)local_1a8,alias,(allocator *)local_250);
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"[@","");
  bVar3 = startsWith((string *)local_1a8,(string *)local_2b0);
  bVar4 = true;
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_1c8,alias,&local_2b1);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"]","");
    bVar4 = endsWith(&local_1c8,&local_230);
    bVar4 = !bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
  }
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"error: tag alias, \"",0x13);
    poVar5 = std::operator<<((ostream *)local_1a8,alias);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" is not of the form [@alias name].\n",0x24);
    operator<<(poVar5,lineInfo);
    pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(pdVar6,(char *)local_2b0._0_8_);
    __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::string((string *)&local_1e8,tag,(allocator *)local_250);
  paVar1 = &local_210.file.field_2;
  pcVar2 = (lineInfo->file)._M_dataplus._M_p;
  local_210.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar2,pcVar2 + (lineInfo->file)._M_string_length);
  local_210.line = lineInfo->line;
  TagAlias::TagAlias((TagAlias *)local_2b0,&local_1e8,&local_210);
  if ((undefined1 *)local_2b0._0_8_ == local_2b0 + 0x10) {
    local_190[8] = local_2b0[0x18];
    local_190[9] = local_2b0[0x19];
    local_190[10] = local_2b0[0x1a];
    local_190[0xb] = local_2b0[0x1b];
    local_190[0xc] = local_2b0[0x1c];
    local_190[0xd] = local_2b0[0x1d];
    local_190[0xe] = local_2b0[0x1e];
    local_190[0xf] = local_2b0[0x1f];
    local_1a8._8_8_ = local_190;
  }
  else {
    local_1a8._8_8_ = local_2b0._0_8_;
  }
  local_1a8._16_8_ = local_2b0._8_8_;
  local_2b0._8_8_ = 0;
  local_2b0[0x10] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p == &local_280) {
    local_170._8_8_ = local_280._8_8_;
    local_180._M_p = (pointer)&local_170;
  }
  else {
    local_180._M_p = local_290._M_p;
  }
  local_178 = local_288;
  local_288 = 0;
  local_280._M_local_buf[0] = '\0';
  local_160 = local_270;
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_290._M_p = (pointer)&local_280;
  local_258 = lineInfo;
  local_1a8._0_8_ = alias;
  pVar7 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::_M_emplace_unique<std::pair<char_const*,Catch::TagAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                      *)&local_260->m_registry,(pair<const_char_*,_Catch::TagAlias> *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p);
  }
  if ((char *)local_1a8._8_8_ != local_190) {
    operator_delete((void *)local_1a8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &local_280) {
    operator_delete(local_290._M_p);
  }
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"error: tag alias, \"",0x13);
    poVar5 = std::operator<<((ostream *)local_1a8,alias);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" already registered.\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tFirst seen at ",0xf);
    std::__cxx11::string::string((string *)local_250,alias,&local_2b2);
    (*(local_260->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])
              (local_2b0,local_260,local_250);
    operator<<(poVar5,(SourceLineInfo *)(local_2b0._0_8_ + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tRedefined at ",0xe);
    operator<<(poVar5,local_258);
    Option<Catch::TagAlias>::reset((Option<Catch::TagAlias> *)local_2b0);
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(pdVar6,(char *)local_2b0._0_8_);
    __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return;
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }